

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMInterpreter.cpp
# Opt level: O0

BasicValue * __thiscall
cmm::CMMInterpreter::evaluateFunctionCallExpr
          (BasicValue *__return_storage_ptr__,CMMInterpreter *this,VariableEnv *Env,
          FunctionCallAST *FuncCall)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST>_>_>
  *this_00;
  bool bVar1;
  string *psVar2;
  pointer ppVar3;
  list<std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>,_std::allocator<std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>_>_>
  *plVar4;
  pointer ppVar5;
  VariableEnv *local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> Args_1;
  _Self local_68;
  iterator NativeFuncIt;
  undefined1 local_50 [8];
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> Args;
  _Self local_30;
  const_iterator UserFuncIt;
  FunctionCallAST *FuncCall_local;
  VariableEnv *Env_local;
  CMMInterpreter *this_local;
  
  this_00 = this->UserFunctionMap;
  UserFuncIt._M_node = (_Base_ptr)FuncCall;
  psVar2 = FunctionCallAST::getCallee_abi_cxx11_(FuncCall);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST>_>_>
       ::find(this_00,psVar2);
  Args.super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>._M_impl._M_node._M_size =
       (size_t)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST>_>_>
               ::end(this->UserFunctionMap);
  bVar1 = std::operator!=(&local_30,
                          (_Self *)&Args.
                                    super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>
                                    ._M_impl._M_node._M_size);
  if (bVar1) {
    plVar4 = FunctionCallAST::getArguments_abi_cxx11_((FunctionCallAST *)UserFuncIt._M_node);
    evaluateArgumentList
              ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)local_50,this,Env,plVar4);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmm::FunctionDefinitionAST>_>
             ::operator->(&local_30);
    bVar1 = FunctionCallAST::isDynamicBound((FunctionCallAST *)UserFuncIt._M_node);
    local_108 = Env;
    if (!bVar1) {
      local_108 = (VariableEnv *)0x0;
    }
    callUserFunction(__return_storage_ptr__,this,&ppVar3->second,
                     (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)local_50,local_108);
    std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::~list
              ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)local_50);
  }
  else {
    psVar2 = FunctionCallAST::getCallee_abi_cxx11_((FunctionCallAST *)UserFuncIt._M_node);
    local_68._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue_(*)(std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue_(*)(std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_&)>_>_>
         ::find(&this->NativeFunctionMap,psVar2);
    Args_1.super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>._M_impl._M_node.
    _M_size = (size_t)std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue_(*)(std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue_(*)(std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_&)>_>_>
                      ::end(&this->NativeFunctionMap);
    bVar1 = std::operator!=(&local_68,
                            (_Self *)&Args_1.
                                      super__List_base<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>
                                      ._M_impl._M_node._M_size);
    if (bVar1) {
      plVar4 = FunctionCallAST::getArguments_abi_cxx11_((FunctionCallAST *)UserFuncIt._M_node);
      evaluateArgumentList
                ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)local_88,this,Env,plVar4
                );
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cvm::BasicValue_(*)(std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_&)>_>
               ::operator->(&local_68);
      callNativeFunction(__return_storage_ptr__,this,&ppVar5->second,
                         (list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)local_88);
      std::__cxx11::list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>::~list
                ((list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *)local_88);
    }
    else {
      psVar2 = FunctionCallAST::getCallee_abi_cxx11_((FunctionCallAST *)UserFuncIt._M_node);
      std::operator+(&local_c8,"function `",psVar2);
      std::operator+(&local_a8,&local_c8,"\' is undefined");
      RuntimeError(this,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      evaluateFunctionCallExpr
                (__return_storage_ptr__,this,(VariableEnv *)0x0,(FunctionCallAST *)0x0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cvm::BasicValue
CMMInterpreter::evaluateFunctionCallExpr(VariableEnv *Env,
                                         const FunctionCallAST *FuncCall) {
  auto UserFuncIt = UserFunctionMap.find(FuncCall->getCallee());
  if (UserFuncIt != UserFunctionMap.end()) {
    auto Args(evaluateArgumentList(Env, FuncCall->getArguments()));
    return callUserFunction(UserFuncIt->second, Args,
                            FuncCall->isDynamicBound() ? Env : nullptr);
  }

  auto NativeFuncIt = NativeFunctionMap.find(FuncCall->getCallee());
  if (NativeFuncIt != NativeFunctionMap.end()) {
    auto Args(evaluateArgumentList(Env, FuncCall->getArguments()));
    return callNativeFunction(NativeFuncIt->second, Args);
  }

  RuntimeError("function `" + FuncCall->getCallee() + "' is undefined");
  return evaluateFunctionCallExpr(nullptr, nullptr); // Make the compiler happy.
}